

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

OPJ_BOOL opj_set_decode_area(opj_codec_t *p_codec,opj_image_t *p_image,OPJ_INT32 p_start_x,
                            OPJ_INT32 p_start_y,OPJ_INT32 p_end_x,OPJ_INT32 p_end_y)

{
  OPJ_BOOL OVar1;
  opj_codec_private_t *l_codec;
  undefined4 in_register_0000000c;
  
  if ((p_codec != (opj_codec_t *)0x0) && (*(int *)(p_codec + 0x12) != 0)) {
    OVar1 = (*(code *)p_codec[7])
                      (p_codec[0xb],p_image,p_start_x,CONCAT44(in_register_0000000c,p_start_y),
                       p_end_x,p_end_y,p_codec + 0xc);
    return OVar1;
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_set_decode_area(opj_codec_t *p_codec,
        opj_image_t* p_image,
        OPJ_INT32 p_start_x, OPJ_INT32 p_start_y,
        OPJ_INT32 p_end_x, OPJ_INT32 p_end_y
                                         )
{
    if (p_codec) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

        if (! l_codec->is_decompressor) {
            return OPJ_FALSE;
        }

        return  l_codec->m_codec_data.m_decompression.opj_set_decode_area(
                    l_codec->m_codec,
                    p_image,
                    p_start_x, p_start_y,
                    p_end_x, p_end_y,
                    &(l_codec->m_event_mgr));
    }
    return OPJ_FALSE;
}